

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O2

void __thiscall OpenMD::Stats::collectStats(Stats *this)

{
  Snapshot *this_00;
  BaseAccumulator *pBVar1;
  pointer pVVar2;
  long *plVar3;
  VectorAccumulator *this_01;
  MatrixAccumulator *this_02;
  PotVecAccumulator *this_03;
  long lVar4;
  pointer *ppVVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  Thermo thermo;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> Jc;
  pointer local_a8;
  pointer local_a0;
  pointer local_98 [4];
  ulong local_78;
  double local_70;
  potVec local_68;
  
  thermo.info_ = this->info_;
  this_00 = (thermo.info_)->sman_->currentSnapshot_;
  uVar8 = 0;
  do {
    if (uVar8 == 0x2e) {
      return;
    }
    if (((this->statsMask_).super__Base_bitset<1UL>._M_w >> (uVar8 & 0x3f) & 1) == 0)
    goto switchD_001d0256_caseD_23;
    switch(uVar8 & 0xffffffff) {
    case 0:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Jc.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)Snapshot::getTime(this_00);
      break;
    case 1:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Jc.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)Thermo::getTotalEnergy(&thermo);
      break;
    case 2:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Jc.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)Thermo::getPotential(&thermo);
      break;
    case 3:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Jc.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)Thermo::getKinetic(&thermo);
      break;
    case 4:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Jc.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)Thermo::getTemperature(&thermo);
      break;
    case 5:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Jc.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)Thermo::getPressure(&thermo);
      break;
    case 6:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Jc.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)Thermo::getVolume(&thermo);
      break;
    case 7:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Jc.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)Thermo::getHullVolume(&thermo);
      break;
    case 8:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Jc.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)Thermo::getGyrationalVolume(&thermo);
      break;
    case 9:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Jc.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)Snapshot::getConservedQuantity(this_00);
      break;
    case 10:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Jc.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)Thermo::getTranslationalKinetic(&thermo);
      break;
    case 0xb:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Jc.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)Thermo::getRotationalKinetic(&thermo);
      break;
    case 0xc:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Jc.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)Thermo::getElectronicKinetic(&thermo);
      break;
    case 0xd:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Jc.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)Snapshot::getLongRangePotential(this_00);
      break;
    case 0xe:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Snapshot::getLongRangePotentials((potVec *)&Jc,this_00);
      lVar4 = *plVar3;
      ppVVar5 = &Jc.
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_001d105c;
    case 0xf:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Snapshot::getLongRangePotentials((potVec *)&Jc,this_00);
      pVVar2 = Jc.
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      Snapshot::getSelfPotentials(&local_68,this_00);
      local_70 = (double)pVVar2 + local_68.data_[2];
      goto LAB_001d1012;
    case 0x10:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Snapshot::getSelfPotentials((potVec *)&Jc,this_00);
      pVVar2 = local_a8;
      Snapshot::getLongRangePotentials(&local_68,this_00);
      local_70 = (double)pVVar2 + local_68.data_[4];
LAB_001d1012:
      (**(code **)(*plVar3 + 0x20))(plVar3);
      goto switchD_001d0256_caseD_23;
    case 0x11:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Snapshot::getSelfPotentials((potVec *)&Jc,this_00);
      lVar4 = *plVar3;
      ppVVar5 = &local_a8;
      goto LAB_001d105c;
    case 0x12:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Snapshot::getLongRangePotentials((potVec *)&Jc,this_00);
      lVar4 = *plVar3;
      ppVVar5 = &local_a0;
      goto LAB_001d105c;
    case 0x13:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Snapshot::getLongRangePotentials((potVec *)&Jc,this_00);
      lVar4 = *plVar3;
      ppVVar5 = local_98;
      goto LAB_001d105c;
    case 0x14:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Jc.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)Snapshot::getReciprocalPotential(this_00);
      break;
    case 0x15:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Jc.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)Snapshot::getSurfacePotential(this_00);
      break;
    case 0x16:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Jc.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)Snapshot::getShortRangePotential(this_00);
      break;
    case 0x17:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Jc.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)Snapshot::getBondPotential(this_00);
      break;
    case 0x18:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Jc.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)Snapshot::getBendPotential(this_00);
      break;
    case 0x19:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Jc.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)Snapshot::getTorsionPotential(this_00);
      break;
    case 0x1a:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Jc.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)Snapshot::getInversionPotential(this_00);
      break;
    case 0x1b:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Jc.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)Snapshot::getRawPotential(this_00);
      break;
    case 0x1c:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Jc.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)Snapshot::getRestraintPotential(this_00);
      break;
    case 0x1d:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Jc.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)Snapshot::getExcludedPotential(this_00);
      break;
    case 0x1e:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        this_02 = (MatrixAccumulator *)0x0;
      }
      else {
        this_02 = (MatrixAccumulator *)
                  __dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&MatrixAccumulator::typeinfo,0);
      }
      Thermo::getPressureTensor((Mat3x3d *)&Jc,&thermo);
      goto LAB_001d0f34;
    case 0x1f:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        this_02 = (MatrixAccumulator *)0x0;
      }
      else {
        this_02 = (MatrixAccumulator *)
                  __dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&MatrixAccumulator::typeinfo,0);
      }
      Snapshot::getVirialTensor((Mat3x3d *)&Jc,this_00);
      goto LAB_001d0f34;
    case 0x20:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        this_01 = (VectorAccumulator *)0x0;
      }
      else {
        this_01 = (VectorAccumulator *)
                  __dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&VectorAccumulator::typeinfo,0);
      }
      Thermo::getSystemDipole((Vector3d *)&Jc,&thermo);
      goto LAB_001d1076;
    case 0x21:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        this_02 = (MatrixAccumulator *)0x0;
      }
      else {
        this_02 = (MatrixAccumulator *)
                  __dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&MatrixAccumulator::typeinfo,0);
      }
      Thermo::getSystemQuadrupole((Mat3x3d *)&Jc,&thermo);
LAB_001d0f34:
      MatrixAccumulator::add(this_02,(ElementType *)&Jc);
      goto switchD_001d0256_caseD_23;
    case 0x22:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Jc.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)Thermo::getTaggedAtomPairDistance(&thermo)
      ;
      break;
    default:
      goto switchD_001d0256_caseD_23;
    case 0x25:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        this_01 = (VectorAccumulator *)0x0;
      }
      else {
        this_01 = (VectorAccumulator *)
                  __dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&VectorAccumulator::typeinfo,0);
      }
      Thermo::getHeatFlux((Vector3d *)&Jc,&thermo);
      goto LAB_001d1076;
    case 0x26:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Jc.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)Thermo::getElectronicTemperature(&thermo);
      break;
    case 0x27:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        this_01 = (VectorAccumulator *)0x0;
      }
      else {
        this_01 = (VectorAccumulator *)
                  __dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&VectorAccumulator::typeinfo,0);
      }
      Thermo::getCom((Vector3d *)&Jc,&thermo);
      goto LAB_001d1076;
    case 0x28:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        this_01 = (VectorAccumulator *)0x0;
      }
      else {
        this_01 = (VectorAccumulator *)
                  __dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&VectorAccumulator::typeinfo,0);
      }
      Thermo::getComVel((Vector3d *)&Jc,&thermo);
      goto LAB_001d1076;
    case 0x29:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        this_01 = (VectorAccumulator *)0x0;
      }
      else {
        this_01 = (VectorAccumulator *)
                  __dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&VectorAccumulator::typeinfo,0);
      }
      Thermo::getAngularMomentum((Vector3d *)&Jc,&thermo);
LAB_001d1076:
      VectorAccumulator::add(this_01,(ElementType *)&Jc);
      goto switchD_001d0256_caseD_23;
    case 0x2a:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        this_03 = (PotVecAccumulator *)0x0;
      }
      else {
        this_03 = (PotVecAccumulator *)
                  __dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&PotVecAccumulator::typeinfo,0);
      }
      Thermo::getSelectionPotentials((potVec *)&Jc,&thermo);
      PotVecAccumulator::add(this_03,(potVec *)&Jc);
      goto switchD_001d0256_caseD_23;
    case 0x2b:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Jc.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)Thermo::getNetCharge(&thermo);
      break;
    case 0x2c:
      pBVar1 = (this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].accumulator;
      if (pBVar1 == (BaseAccumulator *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pBVar1,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      }
      Jc.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)Thermo::getChargeMomentum(&thermo);
      break;
    case 0x2d:
      Thermo::getCurrentDensity(&Jc,&thermo);
      uVar9 = 2;
      local_78 = uVar8;
      for (uVar6 = 0; uVar8 = local_78,
          pVVar2 = Jc.
                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start, uVar7 = (ulong)uVar6,
          uVar7 < (ulong)(((long)Jc.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)Jc.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x18);
          uVar6 = uVar6 + 1) {
        plVar3 = (long *)__dynamic_cast(*(undefined8 *)
                                         (*(long *)&(this->data_).
                                                                                                        
                                                  super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [local_78].accumulatorArray2d.
                                                  super__Vector_base<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>
                                                  ._M_impl + (ulong)(uVar9 - 2) * 8),
                                        &BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
        (**(code **)(*plVar3 + 0x20))(plVar3,pVVar2 + uVar7);
        plVar3 = (long *)__dynamic_cast(*(undefined8 *)
                                         (*(long *)&(this->data_).
                                                                                                        
                                                  super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar8].
                                                  accumulatorArray2d.
                                                  super__Vector_base<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>
                                                  ._M_impl + (ulong)(uVar9 - 1) * 8),
                                        &BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
        (**(code **)(*plVar3 + 0x20))
                  (plVar3,Jc.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar7].super_Vector<double,_3U>.
                          data_ + 1);
        plVar3 = (long *)__dynamic_cast(*(undefined8 *)
                                         (*(long *)&(this->data_).
                                                                                                        
                                                  super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar8].
                                                  accumulatorArray2d.
                                                  super__Vector_base<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>
                                                  ._M_impl + (ulong)uVar9 * 8),
                                        &BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
        (**(code **)(*plVar3 + 0x20))
                  (plVar3,Jc.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar7].super_Vector<double,_3U>.
                          data_ + 2);
        uVar9 = uVar9 + 3;
      }
      std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
      ~_Vector_base(&Jc.
                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                   );
      goto switchD_001d0256_caseD_23;
    }
    ppVVar5 = (pointer *)&Jc;
    lVar4 = *plVar3;
LAB_001d105c:
    (**(code **)(lVar4 + 0x20))(plVar3,ppVVar5);
switchD_001d0256_caseD_23:
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void Stats::collectStats() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();
    Thermo thermo(info_);

    for (unsigned int i = 0; i < statsMask_.size(); ++i) {
      if (statsMask_[i]) {
        switch (i) {
        case TIME:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getTime());
          break;
        case KINETIC_ENERGY:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getKinetic());
          break;
        case POTENTIAL_ENERGY:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getPotential());
          break;
        case TOTAL_ENERGY:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getTotalEnergy());
          break;
        case TEMPERATURE:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getTemperature());
          break;
        case PRESSURE:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getPressure());
          break;
        case VOLUME:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getVolume());
          break;
        case CONSERVED_QUANTITY:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getConservedQuantity());
          break;
        case PRESSURE_TENSOR:
          dynamic_cast<MatrixAccumulator*>(data_[i].accumulator)
              ->add(thermo.getPressureTensor());
          break;
          // virial Tensor
        case VIRIAL_TENSOR:
          dynamic_cast<MatrixAccumulator*>(data_[i].accumulator)
              ->add(snap->getVirialTensor());
          break;

        case SYSTEM_DIPOLE:
          dynamic_cast<VectorAccumulator*>(data_[i].accumulator)
              ->add(thermo.getSystemDipole());
          break;
        case SYSTEM_QUADRUPOLE:
          dynamic_cast<MatrixAccumulator*>(data_[i].accumulator)
              ->add(thermo.getSystemQuadrupole());
          break;
        case HEATFLUX:
          dynamic_cast<VectorAccumulator*>(data_[i].accumulator)
              ->add(thermo.getHeatFlux());
          break;
        case HULLVOLUME:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getHullVolume());
          break;
        case GYRVOLUME:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getGyrationalVolume());
          break;
        case TRANSLATIONAL_KINETIC:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getTranslationalKinetic());
          break;
        case ROTATIONAL_KINETIC:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getRotationalKinetic());
          break;
        case ELECTRONIC_KINETIC:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getElectronicKinetic());
          break;
        case LONG_RANGE_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getLongRangePotential());
          break;
        case VANDERWAALS_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getLongRangePotentials()[VANDERWAALS_FAMILY]);
          break;
        case ELECTROSTATIC_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getLongRangePotentials()[ELECTROSTATIC_FAMILY] +
                    snap->getSelfPotentials()[ELECTROSTATIC_FAMILY]);
          break;
        case METALLIC_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getSelfPotentials()[METALLIC_EMBEDDING_FAMILY] +
                    snap->getLongRangePotentials()[METALLIC_PAIR_FAMILY]);
          break;
        case METALLIC_EMBEDDING:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getSelfPotentials()[METALLIC_EMBEDDING_FAMILY]);
          break;
        case METALLIC_PAIR:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getLongRangePotentials()[METALLIC_PAIR_FAMILY]);
          break;
        case HYDROGENBONDING_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getLongRangePotentials()[HYDROGENBONDING_FAMILY]);
          break;
        case RECIPROCAL_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getReciprocalPotential());
          break;
        case SURFACE_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getSurfacePotential());
          break;
        case SHORT_RANGE_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getShortRangePotential());
          break;
        case BOND_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getBondPotential());
          break;
        case BEND_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getBendPotential());
          break;
        case DIHEDRAL_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getTorsionPotential());
          break;
        case INVERSION_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getInversionPotential());
          break;
        case RAW_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getRawPotential());
          break;
        case RESTRAINT_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getRestraintPotential());
          break;
        case EXCLUDED_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getExcludedPotential());
          break;
        case TAGGED_PAIR_DISTANCE:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getTaggedAtomPairDistance());
          break;
        case ELECTRONIC_TEMPERATURE:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getElectronicTemperature());
          break;
        case COM:
          dynamic_cast<VectorAccumulator*>(data_[i].accumulator)
              ->add(thermo.getCom());
          break;
        case COM_VELOCITY:
          dynamic_cast<VectorAccumulator*>(data_[i].accumulator)
              ->add(thermo.getComVel());
          break;
        case ANGULAR_MOMENTUM:
          dynamic_cast<VectorAccumulator*>(data_[i].accumulator)
              ->add(thermo.getAngularMomentum());
          break;
        case POTENTIAL_SELECTION:
          dynamic_cast<PotVecAccumulator*>(data_[i].accumulator)
              ->add(thermo.getSelectionPotentials());
          break;
        case NET_CHARGE:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getNetCharge());
          break;
        case CHARGE_MOMENTUM:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getChargeMomentum());
          break;
        case CURRENT_DENSITY:
          unsigned int k           = 0;
          std::vector<Vector3d> Jc = thermo.getCurrentDensity();
          for (unsigned int j = 0; j < Jc.size(); ++j) {
            dynamic_cast<Accumulator*>(data_[i].accumulatorArray2d[k++])
                ->add(Jc[j][0]);
            dynamic_cast<Accumulator*>(data_[i].accumulatorArray2d[k++])
                ->add(Jc[j][1]);
            dynamic_cast<Accumulator*>(data_[i].accumulatorArray2d[k++])
                ->add(Jc[j][2]);
          }
          break;

          /*
            case SHADOWH:
            dynamic_cast<Accumulator
            *>(data_[i].accumulator)->add(thermo.getShadowHamiltionian());
            break; case HELFANDMOMENT: dynamic_cast<Accumulator
            *>(data_[i].accumulator)->add(thermo.getHelfandMoment()); break;
          */
        }
      }
    }
  }